

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O2

void ClearLocks(void)

{
  BYTE *pBVar1;
  Lock *this;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  
  for (uVar3 = 0; uVar3 < PClassActor::AllActorClasses.Count; uVar3 = uVar3 + 1) {
    bVar2 = PClass::IsAncestorOf
                      (AKey::RegistrationInfo.MyClass,
                       &PClassActor::AllActorClasses.Array[uVar3]->super_PClass);
    if ((bVar2) &&
       (pBVar1 = (PClassActor::AllActorClasses.Array[uVar3]->super_PClass).Defaults,
       pBVar1 != (BYTE *)0x0)) {
      pBVar1[0x4dc] = '\0';
    }
  }
  for (lVar4 = 0; lVar4 != 0x800; lVar4 = lVar4 + 8) {
    this = *(Lock **)((long)locks + lVar4);
    if (this != (Lock *)0x0) {
      Lock::~Lock(this);
      operator_delete(this,0x38);
      *(undefined8 *)((long)locks + lVar4) = 0;
    }
  }
  currentnumber = 0;
  keysdone = 0;
  return;
}

Assistant:

static void ClearLocks()
{
	unsigned int i;
	for(i = 0; i < PClassActor::AllActorClasses.Size(); i++)
	{
		if (PClassActor::AllActorClasses[i]->IsDescendantOf(RUNTIME_CLASS(AKey)))
		{
			AKey *key = static_cast<AKey*>(GetDefaultByType(PClassActor::AllActorClasses[i]));
			if (key != NULL)
			{
				key->KeyNumber = 0;
			}
		}
	}
	for(i = 0; i < 256; i++)
	{
		if (locks[i] != NULL) 
		{
			delete locks[i];
			locks[i] = NULL;
		}
	}
	currentnumber = 0;
	keysdone = false;
}